

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GregorianCalendar.cpp
# Opt level: O3

void __thiscall GregorianCalendar::GregorianCalendar(GregorianCalendar *this,int date)

{
  GregorianCalendar *pGVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  GregorianCalendar t;
  GregorianCalendar local_50;
  GregorianCalendar *local_38;
  
  (this->super_Calendar).month = 1;
  (this->super_Calendar).day = 1;
  (this->super_Calendar)._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_001ad330;
  uVar5 = date / 0x16e - 1;
  do {
    local_50.super_Calendar.year = uVar5 + 2;
    local_50.super_Calendar.month = 1;
    local_50.super_Calendar.day = 1;
    local_50.super_Calendar._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_001ad330;
    iVar2 = operator_cast_to_int(&local_50);
    uVar5 = uVar5 + 1;
  } while (iVar2 <= date);
  (this->super_Calendar).year = uVar5;
  uVar3 = uVar5 * -0x3d70a3d7 + 0x51eb850;
  uVar4 = 0;
  local_38 = this;
  do {
    uVar4 = uVar4 + 1;
    if ((0xb < uVar4) ||
       ((local_50.super_Calendar.day = 0x1e, (0xa50U >> (uVar4 & 0x1f) & 1) == 0 &&
        (local_50.super_Calendar.day =
              ((uVar3 >> 4 | uVar5 * -0x70000000) < 0xa3d70b ||
              0x28f5c28 < (uVar3 >> 2 | uVar5 * 0x40000000) && (uVar5 & 3) == 0) | 0x1c, uVar4 != 2)
        ))) {
      local_50.super_Calendar.day = 0x1f;
    }
    local_50.super_Calendar.month = uVar4;
    local_50.super_Calendar._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_001ad330;
    local_50.super_Calendar.year = uVar5;
    iVar2 = operator_cast_to_int(&local_50);
    pGVar1 = local_38;
  } while (iVar2 < date);
  (local_38->super_Calendar).month = uVar4;
  local_50.super_Calendar.day = 1;
  local_50.super_Calendar._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_001ad330;
  local_50.super_Calendar.year = uVar5;
  iVar2 = operator_cast_to_int(&local_50);
  (pGVar1->super_Calendar).day = (date - iVar2) + 1;
  return;
}

Assistant:

GregorianCalendar::GregorianCalendar(int date) {
    year = date / (365 + 1);
    while (date >= GregorianCalendar(1, 1, year + 1))
        year++;
    month = 1;
    while (date > GregorianCalendar(month, LastMonthDay(month, year), year))
        month++;
    GregorianCalendar t = GregorianCalendar(month, 1, year);
    day = date - t + 1;
}